

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCAABBTree.cpp
# Opt level: O3

int __thiscall chrono::collision::CHAABBTree::BuildModel(CHAABBTree *this,double envelope)

{
  pointer pCVar1;
  pointer pCVar2;
  long lVar3;
  pointer this_00;
  
  ChCollisionTree::BuildModel(&this->super_ChCollisionTree,envelope);
  if ((this->super_ChCollisionTree).build_state != ChC_BUILD_STATE_PROCESSED) {
    pCVar1 = (this->b).
             super__Vector_base<chrono::collision::CHAABB,_std::allocator<chrono::collision::CHAABB>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pCVar2 = (this->b).
             super__Vector_base<chrono::collision::CHAABB,_std::allocator<chrono::collision::CHAABB>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    this_00 = pCVar1;
    if (pCVar2 != pCVar1) {
      do {
        CHAABB::~CHAABB(this_00);
        this_00 = this_00 + 1;
      } while (this_00 != pCVar2);
      (this->b).
      super__Vector_base<chrono::collision::CHAABB,_std::allocator<chrono::collision::CHAABB>_>.
      _M_impl.super__Vector_impl_data._M_finish = pCVar1;
    }
    lVar3 = (long)(this->super_ChCollisionTree).num_geometries;
    if (lVar3 != 0) {
      std::vector<chrono::collision::CHAABB,_std::allocator<chrono::collision::CHAABB>_>::resize
                (&this->b,lVar3 * 2 - 1);
      this->current_box = 1;
      build_recurse(this,0,0,(this->super_ChCollisionTree).num_geometries,envelope);
      (this->super_ChCollisionTree).build_state = ChC_BUILD_STATE_PROCESSED;
    }
  }
  return 0;
}

Assistant:

int CHAABBTree::BuildModel(double envelope) {
    // INHERIT PARENT CLASS RESET FUNCTION
    ChCollisionTree::BuildModel(envelope);

    if (build_state == ChC_BUILD_STATE_PROCESSED) {
        return ChC_OK;
    }

    // create an array of BVs for the model

    b.clear();

    if (num_geometries == 0)
        return ChC_OK;

    b.resize(2 * num_geometries - 1);

    current_box = 0;

    // we should build the model now.

    build_model(envelope);  // %%%%%%%%%%%% BUILD HIERARCHY HERE %%%%%%%%%%%

    build_state = ChC_BUILD_STATE_PROCESSED;

    return ChC_OK;
}